

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

bool __thiscall
ON_PolylineCurve::IsContinuous
          (ON_PolylineCurve *this,continuity desired_continuity,double t,int *hint,
          double point_tolerance,double d1_tolerance,double d2_tolerance,double cos_angle_tolerance,
          double curvature_tolerance)

{
  ON_Polyline *this_00;
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  continuity desired_continuity_00;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  double *pdVar9;
  double dVar10;
  double local_68;
  
  this_00 = &this->m_pline;
  uVar4 = ON_Polyline::SegmentCount(this_00);
  if (0 < (int)uVar4) {
    desired_continuity_00 = ON::PolylineContinuity(desired_continuity);
    pdVar9 = (this->m_t).m_a;
    if ((t <= *pdVar9) || (pdVar9[uVar4] <= t)) {
      if ((desired_continuity_00 < G2_locus_continuous) &&
         (local_68 = t, (0x2c0U >> (desired_continuity_00 & 0x1f) & 1) != 0)) {
LAB_00591461:
        bVar3 = ON_Curve::IsContinuous
                          (&this->super_ON_Curve,desired_continuity_00,local_68,hint,point_tolerance
                           ,d1_tolerance,d2_tolerance,cos_angle_tolerance,curvature_tolerance);
        return bVar3;
      }
    }
    else if (desired_continuity_00 != C0_continuous && uVar4 != 1) {
      iVar5 = ON_Polyline::PointCount(this_00);
      iVar7 = 0;
      if ((this->m_t).m_count < 1) {
        pdVar9 = (double *)0x0;
      }
      else {
        pdVar9 = (this->m_t).m_a;
      }
      if (hint != (int *)0x0) {
        iVar7 = *hint;
      }
      uVar6 = ON_NurbsSpanIndex(2,iVar5,pdVar9,t,0,iVar7);
      pdVar9 = (this->m_t).m_a;
      lVar8 = (long)(int)uVar6;
      dVar1 = pdVar9[lVar8];
      dVar2 = pdVar9[lVar8 + 1];
      dVar10 = (ABS(dVar2 - dVar1) + ABS(dVar2) + ABS(dVar1)) * 1.490116119385e-08;
      local_68 = t;
      if ((dVar1 + dVar10 < dVar2 - dVar10) &&
         ((((int)uVar6 < 1 || (local_68 = dVar1, dVar10 < ABS(t - dVar1))) &&
          (local_68 = t, ABS(t - dVar2) <= dVar10)))) {
        iVar7 = ON_Polyline::PointCount(this_00);
        local_68 = t;
        if ((int)(lVar8 + 1) < iVar7) {
          local_68 = (this->m_t).m_a[lVar8 + 1];
          iVar5 = ON_Polyline::PointCount(this_00);
          iVar7 = 0;
          if ((this->m_t).m_count < 1) {
            pdVar9 = (double *)0x0;
          }
          else {
            pdVar9 = (this->m_t).m_a;
          }
          if (hint != (int *)0x0) {
            iVar7 = *hint;
          }
          uVar6 = ON_NurbsSpanIndex(2,iVar5,pdVar9,local_68,0,iVar7);
        }
      }
      if (hint != (int *)0x0) {
        *hint = uVar6;
      }
      if ((int)uVar6 < (int)uVar4 && 0 < (int)uVar6) {
        pdVar9 = (this->m_t).m_a + uVar6;
        if ((local_68 == *pdVar9) && (!NAN(local_68) && !NAN(*pdVar9))) {
          desired_continuity_00 = ON::ParametricContinuity(desired_continuity_00);
          goto LAB_00591461;
        }
      }
    }
  }
  return true;
}

Assistant:

bool ON_PolylineCurve::IsContinuous(
    ON::continuity desired_continuity,
    double t, 
    int* hint, // default = nullptr,
    double point_tolerance, // default=ON_ZERO_TOLERANCE
    double d1_tolerance, // default==ON_ZERO_TOLERANCE
    double d2_tolerance, // default==ON_ZERO_TOLERANCE
    double cos_angle_tolerance, // default==ON_DEFAULT_ANGLE_TOLERANCE_COSINE
    double curvature_tolerance  // default==ON_SQRT_EPSILON
    ) const
{
  bool rc = true;
  const int segment_count = m_pline.SegmentCount();

  if ( segment_count >= 1 )
  {
    bool bPerformTest = false;
    desired_continuity = ON::PolylineContinuity((int)desired_continuity);

    if ( t <= m_t[0] || t >= m_t[segment_count] )
    {
      // 20 March 2003 Dale Lear
      //     Consistently handles locus case and out of domain case.
      switch(desired_continuity)
      {
      case ON::continuity::C0_locus_continuous: 
      case ON::continuity::C1_locus_continuous: 
      case ON::continuity::G1_locus_continuous: 
        bPerformTest = true;
        break;
      default:
        // intentionally ignoring other ON::continuity enum values
        break;
      }
    }
    else
    {
      if ( segment_count >= 2 && desired_continuity != ON::continuity::C0_continuous ) 
      {
        int i = ON_NurbsSpanIndex(2,PointCount(),m_t,t,0,(hint)?*hint:0);
        
        {
          // 20 March 2003 Dale Lear:
          //     If t is very near interior m_t[] value, see if it
          //     should be set to that value.  A bit or two of 
          //     precision sometimes gets lost in proxy
          //     domain to real curve domain conversions on the interior
          //     of a curve domain.
          double segtol = (fabs(m_t[i]) + fabs(m_t[i+1]) + fabs(m_t[i+1]-m_t[i]))*ON_SQRT_EPSILON;
          if ( m_t[i]+segtol < m_t[i+1]-segtol )
          {
            if ( fabs(t-m_t[i]) <= segtol && i > 0 )
            {
              t = m_t[i];
            }
            else if ( fabs(t-m_t[i+1]) <= segtol && i+1 < PointCount() )
            {
              t = m_t[i+1];
              i = ON_NurbsSpanIndex(2,PointCount(),m_t,t,0,(hint)?*hint:0);
            }
          }
        }
        
        if ( hint )
          *hint = i;
        if ( i > 0 && i < segment_count && t == m_t[i] )
        {
          // "locus" and "parametric" tests are the same at this point.
          desired_continuity = ON::ParametricContinuity((int)desired_continuity);
          bPerformTest = true;
        }
      }
    }

    if ( bPerformTest )
    {
      // need to evaluate and test
      rc = ON_Curve::IsContinuous( desired_continuity, t, hint,
                                   point_tolerance, d1_tolerance, d2_tolerance,
                                   cos_angle_tolerance, curvature_tolerance );
    }
  }

  return rc;
}